

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsCLI11.hpp
# Opt level: O2

void __thiscall helics::helicsCLI11App::remove_helics_specifics(helicsCLI11App *this)

{
  Option *opt;
  App *subcom;
  allocator<char> local_d3;
  allocator<char> local_d2;
  allocator<char> local_d1;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"",&local_d2);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"",&local_d3);
  CLI::App::set_help_flag(&this->super_App,&local_30,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"",&local_d2);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"",&local_d3);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,"Read an ini file",&local_d1);
  CLI::App::set_config(&this->super_App,&local_50,&local_70,&local_d0,false);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"-v",(allocator<char> *)&local_d0);
  opt = CLI::App::get_option_no_throw(&this->super_App,&local_90);
  CLI::App::remove_option(&this->super_App,opt);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,"quiet",(allocator<char> *)&local_d0);
  subcom = CLI::App::get_option_group(&this->super_App,&local_b0);
  CLI::App::remove_subcommand(&this->super_App,subcom);
  std::__cxx11::string::~string((string *)&local_b0);
  return;
}

Assistant:

void remove_helics_specifics()
    {
        set_help_flag();
        set_config();
        try {
            remove_option(get_option_no_throw("-v"));
            remove_subcommand(get_option_group("quiet"));
        }
        catch (const CLI::Error&) {
            // must have been removed earlier
        }
    }